

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMS_TIME_INFO_Unmarshal(TPMS_TIME_INFO *target,BYTE **buffer,INT32 *size)

{
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMS_TIME_INFO *target_local;
  
  target_local._4_4_ = UINT64_Unmarshal(&target->time,buffer,size);
  if (target_local._4_4_ == 0) {
    target_local._4_4_ = TPMS_CLOCK_INFO_Unmarshal(&target->clockInfo,buffer,size);
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMS_TIME_INFO_Unmarshal(TPMS_TIME_INFO *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT64_Unmarshal((UINT64 *)&(target->time), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMS_CLOCK_INFO_Unmarshal((TPMS_CLOCK_INFO *)&(target->clockInfo), buffer, size);
    return result;
}